

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

SamplerWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateSampler
          (SamplerWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkSamplerCreateInfo *SamplerCI,char *DebugName)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  VkSamplerCreateInfo *SamplerCI_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (SamplerCI->sType != VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO) {
    Diligent::FormatString<char[26],char[57]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SamplerCI.sType == VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO",
               (char (*) [57])DebugName);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CreateSampler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xda);
    std::__cxx11::string::~string((string *)local_48);
  }
  CreateVulkanObject<VkSampler_T*,(VulkanUtilities::VulkanHandleTypeId)12,VkResult(*)(VkDevice_T*,VkSamplerCreateInfo_const*,VkAllocationCallbacks_const*,VkSampler_T**),VkSamplerCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkSamplerCreateInfo_ptr_VkAllocationCallbacks_ptr_VkSampler_T_ptr_ptr
              *)vkCreateSampler,SamplerCI,(char *)msg.field_2._8_8_,"sampler");
  return __return_storage_ptr__;
}

Assistant:

SamplerWrapper VulkanLogicalDevice::CreateSampler(const VkSamplerCreateInfo& SamplerCI, const char* DebugName) const
{
    VERIFY_EXPR(SamplerCI.sType == VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO);
    return CreateVulkanObject<VkSampler, VulkanHandleTypeId::Sampler>(vkCreateSampler, SamplerCI, DebugName, "sampler");
}